

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O0

bool DirOpus(Disk *disk)

{
  value_type vVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  undefined8 uVar7;
  const_reference pvVar8;
  uint uVar9;
  int iVar10;
  char local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  uint local_1a4;
  uint local_1a0;
  int start;
  int length;
  value_type type;
  Data *dataS;
  Sector *local_180;
  Sector *sectorS;
  int local_170;
  int sec;
  int head;
  int cyl;
  string local_148;
  allocator local_121;
  string local_120;
  undefined1 local_100 [8];
  string name;
  string local_d0;
  uint local_b0;
  uint local_ac;
  int uLastBlock;
  int uFirstBlock;
  int j;
  int dir_entries;
  OPUS_DIR *pd;
  OPD_BOOT *ob;
  Data *data;
  Sector *local_78;
  Sector *sector;
  int i;
  int cat_blocks;
  int uBlocks;
  int uFiles;
  int sectors;
  int heads;
  int cyls;
  Format fmt;
  Disk *disk_local;
  
  fmt._52_8_ = disk;
  Format::Format((Format *)&heads,OPD);
  sectors = 1;
  uFiles = 1;
  uBlocks = 1;
  cat_blocks = 0;
  i = 0;
  sector._4_4_ = 1;
  sector._0_4_ = 0;
  do {
    uVar7 = fmt._52_8_;
    if (sector._4_4_ < (int)sector) {
      return true;
    }
    Header::Header((Header *)&data,0,0,(int)sector,1);
    local_78 = Disk::get_sector((Disk *)uVar7,(Header *)&data);
    ob = (OPD_BOOT *)Sector::data_copy(local_78,0);
    if ((int)sector == 0) {
      pd = (OPUS_DIR *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ob);
      sectors = (int)pd->first_block[0];
      uFiles = 1;
      if ((pd->last_block[0] & 0x10) != 0) {
        uFiles = 2;
      }
      uBlocks = (int)pd->first_block[1];
      Format::Validate(sectors,uFiles,uBlocks,0x200,0);
    }
    else {
      _j = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ob);
      iVar2 = Format::sector_size((Format *)&heads);
      uFirstBlock = iVar2 / 0x10;
      for (uLastBlock = 0; uLastBlock < uFirstBlock; uLastBlock = uLastBlock + 1) {
        local_ac = (_j[3] & 0xf) << 8 | (uint)_j[2];
        local_b0 = (uint)*(ushort *)(_j + 4);
        if (local_b0 == 0xffff) {
          uVar9 = cat_blocks - 1;
          iVar10 = sector._4_4_ * uFirstBlock;
          uVar3 = ~cat_blocks;
          uVar4 = i + 1;
          uVar5 = local_ac - i;
          iVar2 = Format::sector_size((Format *)&heads);
          util::fmt_abi_cxx11_
                    (&local_d0,"\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                     (ulong)uVar9,(ulong)(uVar3 + iVar10),(ulong)uVar4,(ulong)uVar5,
                     (int)uVar5 / (int)(0x400 / (long)iVar2));
          util::operator<<((LogHelper *)&util::cout,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          return true;
        }
        cat_blocks = cat_blocks + 1;
        i = (local_b0 - local_ac) + 1 + i;
        if (((int)sector == 1) && (uLastBlock == 0)) {
          puVar6 = _j + 6;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_120,(char *)puVar6,10,&local_121);
          util::trim((string *)local_100,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          uVar7 = std::__cxx11::string::c_str();
          util::fmt_abi_cxx11_(&local_148,"%.10s:\n\n",uVar7);
          util::operator<<((LogHelper *)&util::cout,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          sector._4_4_ = local_b0 - local_ac;
          std::__cxx11::string::~string((string *)local_100);
        }
        else {
          util::fmt_abi_cxx11_((string *)&head,"%-10.10s  ",_j + 6);
          util::operator<<((LogHelper *)&util::cout,(string *)&head);
          std::__cxx11::string::~string((string *)&head);
          uVar7 = fmt._52_8_;
          local_ac = local_ac + 1;
          sec = (int)((long)((ulong)(uint)((int)((long)(int)local_ac / (long)uBlocks) >> 0x1f) <<
                             0x20 | (long)(int)local_ac / (long)uBlocks & 0xffffffffU) %
                     (long)sectors);
          local_170 = (int)((long)((ulong)(uint)((int)((long)(int)local_ac / (long)uBlocks) >> 0x1f)
                                   << 0x20 | (long)(int)local_ac / (long)uBlocks & 0xffffffffU) /
                           (long)sectors);
          sectorS._4_4_ = (int)local_ac % uBlocks + fmt.sectors;
          Header::Header((Header *)&dataS,sec,local_170,sectorS._4_4_,1);
          local_180 = Disk::get_sector((Disk *)uVar7,(Header *)&dataS);
          _length = &Sector::data_copy(local_180,0)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_length,0)
          ;
          start._3_1_ = *pvVar8;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_length,2)
          ;
          vVar1 = *pvVar8;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_length,1)
          ;
          local_1a0 = (uint)CONCAT11(vVar1,*pvVar8);
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_length,4)
          ;
          vVar1 = *pvVar8;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_length,3)
          ;
          local_1a4 = (uint)CONCAT11(vVar1,*pvVar8);
          switch(start._3_1_) {
          case '\0':
            util::operator<<((LogHelper *)&util::cout,(char (*) [8])"BASIC  ");
            if ((int)local_1a4 < 10000) {
              util::operator<<((LogHelper *)&util::cout,(int *)&local_1a4);
            }
            break;
          case '\x01':
            util::fmt_abi_cxx11_
                      (&local_1c8,"DATA   %c()",(ulong)(((local_1a4 & 0x3f00) >> 8) + 0x60));
            util::operator<<((LogHelper *)&util::cout,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            break;
          case '\x02':
            util::fmt_abi_cxx11_
                      (&local_1e8,"DATA   %c$()",(ulong)(((local_1a4 & 0x3f00) >> 8) + 0x60));
            util::operator<<((LogHelper *)&util::cout,&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            break;
          case '\x03':
            util::fmt_abi_cxx11_(&local_208,"CODE   %5u,%u",(ulong)local_1a4,(ulong)local_1a0);
            util::operator<<((LogHelper *)&util::cout,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            break;
          default:
            util::operator<<((LogHelper *)&util::cout,(char (*) [4])"???");
          }
          local_209 = '\n';
          util::operator<<((LogHelper *)&util::cout,&local_209);
        }
        _j = _j + 0x10;
      }
    }
    sector._0_4_ = (int)sector + 1;
  } while( true );
}

Assistant:

bool DirOpus(Disk& disk)
{
    Format fmt{ RegularFormat::OPD };

    auto cyls = 1, heads = 1, sectors = 1;
    auto uFiles = 0, uBlocks = 0;
    auto cat_blocks = 1;

    for (auto i = 0; i <= cat_blocks; ++i)
    {
        auto& sector = disk.get_sector(Header(0, 0, i, 1));
        auto& data = sector.data_copy();

        // First sector has disk geometry
        if (i == 0)
        {
            auto& ob = *reinterpret_cast<const OPD_BOOT*>(data.data());
            cyls = ob.cyls;
            heads = (ob.flags & 0x10) ? 2 : 1;
            sectors = ob.sectors;

            Format::Validate(cyls, heads, sectors);
            continue;
        }

        auto pd = reinterpret_cast<const OPUS_DIR*>(data.data());
        auto dir_entries = fmt.sector_size() / static_cast<int>(sizeof(OPUS_DIR));

        for (auto j = 0; j < dir_entries; ++j, ++pd)
        {
            // Extract the catalogue entry contents
            auto uFirstBlock = ((pd->first_block[1] & 0x0f) << 8) | pd->first_block[0];
            auto uLastBlock = (pd->last_block[1] << 8) | pd->last_block[0];
            //          auto uLastBlockSize = (pd->last_block_size[1] << 8) | pd->last_block_size[0];   // unused here

                        // Directory terminator?
            if (uLastBlock == 0xffff)
            {
                // Don't include catalogue and end marker in file count
                util::cout << util::fmt("\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                    uFiles - 1, cat_blocks * dir_entries - uFiles - 1, uBlocks + 1,
                    uFirstBlock - uBlocks, (uFirstBlock - uBlocks) / (1024 / fmt.sector_size()));
                return true;
            }

            ++uFiles;
            uBlocks += uLastBlock - uFirstBlock + 1;

            // The first entry in the catalogue is the label
            if (i == 1 && !j)
            {
                auto name = util::trim(std::string(pd->szName, sizeof(pd->szName)));
                util::cout << util::fmt("%.10s:\n\n", name.c_str());

                // Update the real number of blocks in the catalogue
                // The first block isn't directory, so subtract an extra 1
                cat_blocks = uLastBlock - uFirstBlock + 1 - 1;
                continue;
            }

            // Output the filename (we don't expand keywords yet)
            util::cout << util::fmt("%-10.10s  ", pd->szName);

            // ToDo: suppress extra info on physical disks, due to seek overhead?
//          if (true)
            {
                // Locate the first sector of the file, which starts with a header
                auto cyl = (++uFirstBlock / sectors) % cyls;
                auto head = (uFirstBlock / sectors) / cyls;
                auto sec = (uFirstBlock % sectors) + fmt.base;

                auto& sectorS = disk.get_sector(Header(cyl, head, sec, 1));
                auto& dataS = sectorS.data_copy();

                // Extract the file type, start and length
                auto type = dataS[0];
                auto length = (dataS[2] << 8) | dataS[1];
                auto start = (dataS[4] << 8) | dataS[3];
                //              auto uUnk = (dataS[6] << 8) | dataS[5];

                                // Display type-dependent information
                switch (type)
                {
                case 0: util::cout << "BASIC  "; if (start < 10000) util::cout << start; break;
                case 1: util::cout << util::fmt("DATA   %c()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 2: util::cout << util::fmt("DATA   %c$()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 3: util::cout << util::fmt("CODE   %5u,%u", start, length); break;
                default: util::cout << "???"; break;
                }
            }

            util::cout << '\n';
        }
    }

    return true;
}